

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcReach.c
# Opt level: O2

void Abc_NtkVerifyUsingBdds
               (Abc_Ntk_t *pNtk,int nBddMax,int nIterMax,int fPartition,int fReorder,int fVerbose)

{
  uint uVar1;
  uint uVar2;
  abctime aVar3;
  Abc_Obj_t *pAVar4;
  DdManager *dd;
  DdNode *n;
  DdNode **pbParts;
  DdNode *n_00;
  DdNode *n_01;
  abctime aVar5;
  int fVerbose_00;
  int iVar6;
  long lVar7;
  int in_stack_ffffffffffffffa8;
  
  iVar6 = nBddMax;
  aVar3 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10d,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  if (pNtk->vPos->nSize != 1) {
    __assert_fail("Abc_NtkPoNum(pNtk) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10e,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  pAVar4 = Abc_NtkPo(pNtk,iVar6);
  if ((pAVar4->vFanouts).nSize != 0) {
    __assert_fail("Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcReach.c"
                  ,0x10f,"void Abc_NtkVerifyUsingBdds(Abc_Ntk_t *, int, int, int, int, int)");
  }
  iVar6 = nBddMax;
  dd = (DdManager *)Abc_NtkBuildGlobalBdds(pNtk,nBddMax,1,fReorder,fVerbose);
  if (dd != (DdManager *)0x0) {
    if (fVerbose != 0) {
      uVar1 = Cudd_ReadKeys(dd);
      uVar2 = Cudd_ReadDead(dd);
      iVar6 = uVar1 - uVar2;
      printf("Shared BDD size is %6d nodes.\n");
    }
    pAVar4 = Abc_NtkPo(pNtk,iVar6);
    n = (DdNode *)Abc_ObjGlobalBdd(pAVar4);
    Cudd_Ref(n);
    pbParts = Abc_NtkCreatePartitions(dd,pNtk,fReorder,fVerbose);
    n_00 = Abc_NtkInitStateVarMap(dd,pNtk,fVerbose_00);
    Cudd_Ref(n_00);
    iVar6 = Cudd_bddLeq(dd,n_00,(DdNode *)((ulong)n ^ 1));
    if (iVar6 == 0) {
      printf("The miter is proved REACHABLE in the initial state.  ");
    }
    else {
      n_01 = Abc_NtkComputeReachable
                       (dd,pNtk,pbParts,n_00,n,nBddMax,nIterMax,fPartition,in_stack_ffffffffffffffa8
                        ,fVerbose);
      if (n_01 != (DdNode *)0x0) {
        Cudd_Ref(n_01);
        Cudd_RecursiveDeref(dd,n_01);
      }
    }
    Cudd_RecursiveDeref(dd,n);
    Cudd_RecursiveDeref(dd,n_00);
    for (lVar7 = 0; lVar7 < pNtk->nObjCounts[8]; lVar7 = lVar7 + 1) {
      Cudd_RecursiveDeref(dd,pbParts[lVar7]);
    }
    free(pbParts);
    Extra_StopManager(dd);
    iVar6 = (int)dd;
    Abc_Print(iVar6,"%s =","Time");
    aVar5 = Abc_Clock();
    Abc_Print(iVar6,"%9.2f sec\n",(double)(aVar5 - aVar3) / 1000000.0);
    fflush(_stdout);
    return;
  }
  printf("The number of intermediate BDD nodes exceeded the limit (%d).\n",nBddMax);
  return;
}

Assistant:

void Abc_NtkVerifyUsingBdds( Abc_Ntk_t * pNtk, int nBddMax, int nIterMax, int fPartition, int fReorder, int fVerbose )
{
    DdManager * dd;
    DdNode ** pbParts;
    DdNode * bOutput, * bReached, * bInitial;
    int i;
    abctime clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) );
    assert( Abc_NtkPoNum(pNtk) == 1 );
    assert( Abc_ObjFanoutNum(Abc_NtkPo(pNtk,0)) == 0 ); // PO should go first

    // compute the global BDDs of the latches
    dd = (DdManager *)Abc_NtkBuildGlobalBdds( pNtk, nBddMax, 1, fReorder, fVerbose );    
    if ( dd == NULL )
    {
        printf( "The number of intermediate BDD nodes exceeded the limit (%d).\n", nBddMax );
        return;
    }
    if ( fVerbose )
        printf( "Shared BDD size is %6d nodes.\n", Cudd_ReadKeys(dd) - Cudd_ReadDead(dd) );

    // save the output BDD
    bOutput = (DdNode *)Abc_ObjGlobalBdd(Abc_NtkPo(pNtk,0)); Cudd_Ref( bOutput );

    // create partitions
    pbParts = Abc_NtkCreatePartitions( dd, pNtk, fReorder, fVerbose );

    // create the initial state and the variable map
    bInitial  = Abc_NtkInitStateVarMap( dd, pNtk, fVerbose );  Cudd_Ref( bInitial );

    // check the result
    if ( !Cudd_bddLeq( dd, bInitial, Cudd_Not(bOutput) ) )
        printf( "The miter is proved REACHABLE in the initial state.  " );
    else
    {
        // compute the reachable states
        bReached = Abc_NtkComputeReachable( dd, pNtk, pbParts, bInitial, bOutput, nBddMax, nIterMax, fPartition, fReorder, fVerbose ); 
        if ( bReached != NULL )
        {
            Cudd_Ref( bReached );
            Cudd_RecursiveDeref( dd, bReached );
        }
    }

    // cleanup
    Cudd_RecursiveDeref( dd, bOutput );
    Cudd_RecursiveDeref( dd, bInitial );
    for ( i = 0; i < Abc_NtkLatchNum(pNtk); i++ )
        Cudd_RecursiveDeref( dd, pbParts[i] );
    ABC_FREE( pbParts );
    Extra_StopManager( dd );

    // report the runtime
    ABC_PRT( "Time", Abc_Clock() - clk );
    fflush( stdout );
}